

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_madd64_q(DisasContext_conflict14 *ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1_low,
                 TCGv_i32 arg1_high,TCGv_i32 arg2,TCGv_i32 arg3,uint32_t n)

{
  TCGContext_conflict9 *s;
  TCGTemp *a2;
  TCGTemp *pTVar1;
  TCGTemp *pTVar2;
  TCGTemp *a1;
  TCGv_i32 pTVar3;
  uintptr_t o_4;
  TCGv_i64 ret;
  uintptr_t o;
  TCGv_i64 ret_00;
  
  s = ctx->uc->tcg_ctx;
  a2 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I64,false);
  pTVar1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar1 - (long)s);
  pTVar2 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)s);
  a1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I64,false);
  tcg_gen_concat_i32_i64_tricore(s,(TCGv_i64)((long)a2 - (long)s),arg1_low,arg1_high);
  tcg_gen_ext_i32_i64_tricore(s,ret_00,arg2);
  tcg_gen_ext_i32_i64_tricore(s,ret,arg3);
  tcg_gen_op3_tricore(s,INDEX_op_mul_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)pTVar2);
  if (n != 0) {
    tcg_gen_shli_i64_tricore(s,ret_00,ret_00,1);
  }
  tcg_gen_op3_tricore(s,INDEX_op_add_i64,(TCGArg)a1,(TCGArg)a2,(TCGArg)pTVar1);
  tcg_gen_op3_tricore(s,INDEX_op_xor_i64,(TCGArg)pTVar2,(TCGArg)a1,(TCGArg)a2);
  tcg_gen_op3_tricore(s,INDEX_op_xor_i64,(TCGArg)pTVar1,(TCGArg)a2,(TCGArg)pTVar1);
  tcg_gen_andc_i64_tricore(s,ret,ret,ret_00);
  tcg_gen_extrh_i64_i32_tricore(s,s->cpu_PSW_V,ret);
  if (n == 1) {
    pTVar1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)pTVar1 - (long)s);
    pTVar2 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
    tcg_gen_setcondi_i32_tricore(s,TCG_COND_EQ,pTVar3,arg2,-0x80000000);
    tcg_gen_setcond_i32_tricore(s,TCG_COND_EQ,(TCGv_i32)((long)pTVar2 - (long)s),arg2,arg3);
    tcg_gen_op3_tricore(s,INDEX_op_and_i32,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)pTVar2);
    tcg_gen_shli_i32_tricore(s,pTVar3,pTVar3,0x1f);
    tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)(s->cpu_PSW_V + (long)s),
                        (TCGArg)(s->cpu_PSW_V + (long)s),(TCGArg)pTVar1);
    tcg_temp_free_internal_tricore(s,pTVar1);
    tcg_temp_free_internal_tricore(s,pTVar2);
  }
  tcg_gen_extr_i64_i32_tricore(s,rl,rh,(TCGv_i64)((long)a1 - (long)s));
  tcg_gen_op3_tricore(s,INDEX_op_or_i32,(TCGArg)(s->cpu_PSW_SV + (long)s),
                      (TCGArg)(s->cpu_PSW_SV + (long)s),(TCGArg)(s->cpu_PSW_V + (long)s));
  pTVar3 = rh + (long)s;
  tcg_gen_op3_tricore(s,INDEX_op_add_i32,(TCGArg)(s->cpu_PSW_AV + (long)s),(TCGArg)pTVar3,
                      (TCGArg)pTVar3);
  tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)(s->cpu_PSW_AV + (long)s),(TCGArg)pTVar3,
                      (TCGArg)(s->cpu_PSW_AV + (long)s));
  tcg_gen_op3_tricore(s,INDEX_op_or_i32,(TCGArg)(s->cpu_PSW_SAV + (long)s),
                      (TCGArg)(s->cpu_PSW_SAV + (long)s),(TCGArg)(s->cpu_PSW_AV + (long)s));
  tcg_temp_free_internal_tricore(s,(TCGTemp *)((TCGv_i64)((long)a2 - (long)s) + (long)s));
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(ret_00 + (long)s));
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_tricore(s,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s) + (long)s));
  return;
}

Assistant:

static inline void
gen_madd64_q(DisasContext *ctx, TCGv rl, TCGv rh, TCGv arg1_low, TCGv arg1_high, TCGv arg2,
             TCGv arg3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t4 = tcg_temp_new_i64(tcg_ctx);
    TCGv temp, temp2;

    tcg_gen_concat_i32_i64(tcg_ctx, t1, arg1_low, arg1_high);
    tcg_gen_ext_i32_i64(tcg_ctx, t2, arg2);
    tcg_gen_ext_i32_i64(tcg_ctx, t3, arg3);

    tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
    if (n != 0) {
        tcg_gen_shli_i64(tcg_ctx, t2, t2, 1);
    }
    tcg_gen_add_i64(tcg_ctx, t4, t1, t2);
    /* calc v bit */
    tcg_gen_xor_i64(tcg_ctx, t3, t4, t1);
    tcg_gen_xor_i64(tcg_ctx, t2, t1, t2);
    tcg_gen_andc_i64(tcg_ctx, t3, t3, t2);
    tcg_gen_extrh_i64_i32(tcg_ctx, tcg_ctx->cpu_PSW_V, t3);
    /* We produce an overflow on the host if the mul before was
       (0x80000000 * 0x80000000) << 1). If this is the
       case, we negate the ovf. */
    if (n == 1) {
        temp = tcg_temp_new(tcg_ctx);
        temp2 = tcg_temp_new(tcg_ctx);
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp, arg2, 0x80000000);
        tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, temp2, arg2, arg3);
        tcg_gen_and_tl(tcg_ctx, temp, temp, temp2);
        tcg_gen_shli_tl(tcg_ctx, temp, temp, 31);
        /* negate v bit, if special condition */
        tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, temp);

        tcg_temp_free(tcg_ctx, temp);
        tcg_temp_free(tcg_ctx, temp2);
    }
    /* write back result */
    tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t4);
    /* Calc SV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
    /* Calc AV/SAV bits */
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, rh, rh);
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, rh, tcg_ctx->cpu_PSW_AV);
    /* calc SAV */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_AV);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
    tcg_temp_free_i64(tcg_ctx, t3);
    tcg_temp_free_i64(tcg_ctx, t4);
}